

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ly_log_dbg(LY_LOG_DBG_GROUP group,char *format,...)

{
  char in_AL;
  int iVar1;
  uint8_t *puVar2;
  LY_ERR *pLVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  char *local_18;
  char *dbg_format;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((ly_log_dbg_groups & group) != 0) {
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    switch(group) {
    case LY_LDGDICT:
      pcVar4 = "DICT";
      break;
    case LY_LDGYANG:
      pcVar4 = "YANG";
      break;
    case LY_LDGYANG|LY_LDGDICT:
    case LY_LDGYIN|LY_LDGDICT:
    case LY_LDGYIN|LY_LDGYANG:
    case LY_LDGYIN|LY_LDGYANG|LY_LDGDICT:
switchD_00111c81_caseD_3:
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/log.c",
             0xba);
      return;
    case LY_LDGYIN:
      pcVar4 = "YIN";
      break;
    case LY_LDGXPATH:
      pcVar4 = "XPATH";
      break;
    default:
      if (group != LY_LDGDIFF) goto switchD_00111c81_caseD_3;
      pcVar4 = "DIFF";
    }
    iVar1 = asprintf(&local_18,"%s: %s",pcVar4);
    if (iVar1 == -1) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_log_dbg");
    }
    else {
      ap[0].overflow_arg_area = local_e8;
      ap[0]._0_8_ = &stack0x00000008;
      local_38._0_4_ = 0x10;
      local_38._4_4_ = 0x30;
      puVar2 = ly_vlog_hide_location();
      log_vprintf(LY_LLDBG,*puVar2,local_18,(char *)0x0,(__va_list_tag *)local_38);
    }
  }
  return;
}

Assistant:

void
ly_log_dbg(LY_LOG_DBG_GROUP group, const char *format, ...)
{
    char *dbg_format;
    const char *str_group;
    va_list ap;

    if (!(ly_log_dbg_groups & group)) {
        return;
    }

    switch (group) {
    case LY_LDGDICT:
        str_group = "DICT";
        break;
    case LY_LDGYANG:
        str_group = "YANG";
        break;
    case LY_LDGYIN:
        str_group = "YIN";
        break;
    case LY_LDGXPATH:
        str_group = "XPATH";
        break;
    case LY_LDGDIFF:
        str_group = "DIFF";
        break;
    default:
        LOGINT;
        return;
    }

    if (asprintf(&dbg_format, "%s: %s", str_group, format) == -1) {
        LOGMEM;
        return;
    }

    va_start(ap, format);
    log_vprintf(LY_LLDBG, (*ly_vlog_hide_location()), dbg_format, NULL, ap);
    va_end(ap);
}